

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

void anon_unknown.dwarf_151f2::Stop(ParseContext *ctx,Lexeme *pos,char *msg,...)

{
  LexemeType LVar1;
  uint uVar2;
  Lexeme *pos_00;
  _func_int **pp_Var3;
  char in_AL;
  int iVar4;
  Lexeme *pLVar5;
  undefined4 extraout_var;
  undefined8 in_RCX;
  char *pos_01;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_d8;
  undefined1 local_b8 [24];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  SynBase *this;
  
  local_d8.reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.overflow_arg_area = &args[0].overflow_arg_area;
  local_d8.gp_offset = 0x18;
  local_d8.fp_offset = 0x30;
  if ((ctx->lastLexeme == pos) && (ctx->firstLexeme != pos)) {
    pos_01 = pos[-1].pos + pos[-1].length;
    pos = pos + -1;
  }
  else {
    pos_01 = pos->pos;
  }
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  StopAt(ctx,pos,pos,pos_01,msg,&local_d8);
  pos_00 = ctx->currentLexeme;
  LVar1 = pos_00->type;
  if (LVar1 == lex_at) {
    if (pos_00[1].type != lex_quotedstring) {
      return;
    }
    pLVar5 = pos_00 + 1;
  }
  else {
    pLVar5 = pos_00;
    if (LVar1 != lex_quotedstring) {
      return;
    }
  }
  pp_Var3 = (_func_int **)pLVar5->pos;
  uVar2 = pLVar5->length;
  ctx->currentLexeme = pLVar5 + 1;
  if (((ulong)uVar2 == 1) || (*(char *)((long)pp_Var3 + (ulong)(uVar2 - 1)) != '\"')) {
    Report(ctx,pos_00,"ERROR: unclosed string constant");
  }
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  this = (SynBase *)CONCAT44(extraout_var,iVar4);
  if (ctx->firstLexeme < ctx->currentLexeme) {
    SynBase::SynBase(this,0x12,pos_00,ctx->currentLexeme + -1);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f400;
    this->field_0x3a = LVar1 == lex_at;
    this[1]._vptr_SynBase = pp_Var3;
    *(char **)&this[1].typeID = (char *)((long)pp_Var3 + (ulong)uVar2);
    return;
  }
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

void Stop(ParseContext &ctx, Lexeme *pos, const char *msg, ...)
	{
		va_list args;
		va_start(args, msg);

		if(pos == ctx.Last() && pos != ctx.First())
			StopAt(ctx, pos - 1, pos - 1, (pos - 1)->pos + (pos - 1)->length, msg, args);
		else
			StopAt(ctx, pos, pos, pos->pos, msg, args);
	}